

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O1

void gc_traverse_trace(global_State *g,GCtrace *T)

{
  IRIns *pIVar1;
  uint64_t uVar2;
  GCobj *o;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  
  if (T->traceno != 0) {
    uVar4 = T->nk;
    if (uVar4 < 0x7ffd) {
      do {
        pIVar1 = T->ir;
        uVar3 = (ulong)uVar4;
        if ((*(char *)((long)pIVar1 + uVar3 * 8 + 5) == '\x18') &&
           ((*(uint8_t *)((long)pIVar1[uVar3 + 1] + 8) & 3) != 0)) {
          gc_mark(g,(GCobj *)pIVar1[uVar3 + 1]);
        }
        uVar5 = uVar4;
        if ((0x605fd9U >> (*(uint *)((long)pIVar1 + uVar3 * 8 + 4) & 0x1f) & 1) != 0) {
          uVar5 = uVar4 + (*(char *)((long)pIVar1 + uVar3 * 8 + 5) != '\x1b');
        }
        uVar4 = uVar5 + 1;
      } while (uVar5 < 0x7ffc);
    }
    if ((ulong)T->link != 0) {
      uVar2 = *(uint64_t *)(g[1].ctype_state.ptr64 + (ulong)T->link * 8);
      if ((*(byte *)(uVar2 + 8) & 3) != 0) {
        *(byte *)(uVar2 + 8) = *(byte *)(uVar2 + 8) & 0xfc;
        *(uint64_t *)(uVar2 + 0x18) = (g->gc).gray.gcptr64;
        (g->gc).gray.gcptr64 = uVar2;
      }
    }
    if ((ulong)T->nextroot != 0) {
      uVar2 = *(uint64_t *)(g[1].ctype_state.ptr64 + (ulong)T->nextroot * 8);
      if ((*(byte *)(uVar2 + 8) & 3) != 0) {
        *(byte *)(uVar2 + 8) = *(byte *)(uVar2 + 8) & 0xfc;
        *(uint64_t *)(uVar2 + 0x18) = (g->gc).gray.gcptr64;
        (g->gc).gray.gcptr64 = uVar2;
      }
    }
    if ((ulong)T->nextside != 0) {
      uVar2 = *(uint64_t *)(g[1].ctype_state.ptr64 + (ulong)T->nextside * 8);
      if ((*(byte *)(uVar2 + 8) & 3) != 0) {
        *(byte *)(uVar2 + 8) = *(byte *)(uVar2 + 8) & 0xfc;
        *(uint64_t *)(uVar2 + 0x18) = (g->gc).gray.gcptr64;
        (g->gc).gray.gcptr64 = uVar2;
      }
    }
    o = (GCobj *)(T->startpt).gcptr64;
    if (((o->gch).marked & 3) != 0) {
      gc_mark(g,o);
      return;
    }
  }
  return;
}

Assistant:

static void gc_traverse_trace(global_State *g, GCtrace *T)
{
  IRRef ref;
  if (T->traceno == 0) return;
  for (ref = T->nk; ref < REF_TRUE; ref++) {
    IRIns *ir = &T->ir[ref];
    if (ir->o == IR_KGC)
      gc_markobj(g, ir_kgc(ir));
    if (irt_is64(ir->t) && ir->o != IR_KNULL)
      ref++;
  }
  if (T->link) gc_marktrace(g, T->link);
  if (T->nextroot) gc_marktrace(g, T->nextroot);
  if (T->nextside) gc_marktrace(g, T->nextside);
  gc_markobj(g, gcref(T->startpt));
}